

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O1

deBool deProcess_sendSignal(deProcess *process,int sigNum)

{
  int iVar1;
  
  if (process->state == PROCESSSTATE_RUNNING) {
    iVar1 = kill(process->pid,sigNum);
    if (iVar1 == 0) {
      return 1;
    }
    deProcess_setErrorFromErrno(process,"kill() failed");
  }
  else {
    deProcess_setError(process,"Process is not running");
  }
  return 0;
}

Assistant:

static deBool deProcess_sendSignal (deProcess* process, int sigNum)
{
	if (process->state != PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process is not running");
		return DE_FALSE;
	}

	if (kill(process->pid, sigNum) == 0)
		return DE_TRUE;
	else
	{
		deProcess_setErrorFromErrno(process, "kill() failed");
		return DE_FALSE;
	}
}